

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
          (Printer *this,string_view begin_varname,string_view end_varname,
          EnumValueDescriptor *descriptor,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  FileDescriptor *this_00;
  string_view file_path;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> path;
  EnumValueDescriptor *descriptor_local;
  Printer *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  string_view end_varname_local;
  string_view begin_varname_local;
  
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)descriptor;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
    EnumValueDescriptor::GetLocationPath
              ((EnumValueDescriptor *)
               path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_58);
    this_00 = EnumValueDescriptor::file
                        ((EnumValueDescriptor *)
                         path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    file_path = FileDescriptor::name(this_00);
    Annotate(this,begin_varname,end_varname,file_path,(vector<int,_std::allocator<int>_> *)local_58,
             semantic);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname, const Desc* descriptor,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  std::vector<int> path;
  descriptor->GetLocationPath(&path);
  Annotate(begin_varname, end_varname, descriptor->file()->name(), path,
           semantic);
}